

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::rc::VertexArray::VertexArray(VertexArray *this,deUint32 name,int maxVertexAttribs)

{
  size_type __n;
  reference pvVar1;
  int local_30;
  int i;
  allocator<sglr::rc::VertexArray::VertexAttribArray> local_19;
  int local_18;
  deUint32 local_14;
  int maxVertexAttribs_local;
  deUint32 name_local;
  VertexArray *this_local;
  
  local_18 = maxVertexAttribs;
  local_14 = name;
  _maxVertexAttribs_local = this;
  NamedObject::NamedObject(&this->super_NamedObject,name);
  (this->super_NamedObject)._vptr_NamedObject = (_func_int **)&PTR__VertexArray_032d8a78;
  this->m_elementArrayBufferBinding = (DataBuffer *)0x0;
  __n = (size_type)local_18;
  std::allocator<sglr::rc::VertexArray::VertexAttribArray>::allocator(&local_19);
  std::
  vector<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
  ::vector(&this->m_arrays,__n,&local_19);
  std::allocator<sglr::rc::VertexArray::VertexAttribArray>::~allocator(&local_19);
  for (local_30 = 0; local_30 < local_18; local_30 = local_30 + 1) {
    pvVar1 = std::
             vector<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
             ::operator[](&this->m_arrays,(long)local_30);
    pvVar1->enabled = false;
    pvVar1 = std::
             vector<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
             ::operator[](&this->m_arrays,(long)local_30);
    pvVar1->size = 4;
    pvVar1 = std::
             vector<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
             ::operator[](&this->m_arrays,(long)local_30);
    pvVar1->stride = 0;
    pvVar1 = std::
             vector<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
             ::operator[](&this->m_arrays,(long)local_30);
    pvVar1->type = 0x1406;
    pvVar1 = std::
             vector<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
             ::operator[](&this->m_arrays,(long)local_30);
    pvVar1->normalized = false;
    pvVar1 = std::
             vector<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
             ::operator[](&this->m_arrays,(long)local_30);
    pvVar1->integer = false;
    pvVar1 = std::
             vector<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
             ::operator[](&this->m_arrays,(long)local_30);
    pvVar1->divisor = 0;
    pvVar1 = std::
             vector<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
             ::operator[](&this->m_arrays,(long)local_30);
    pvVar1->bufferDeleted = false;
    pvVar1 = std::
             vector<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
             ::operator[](&this->m_arrays,(long)local_30);
    pvVar1->bufferBinding = (DataBuffer *)0x0;
    pvVar1 = std::
             vector<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
             ::operator[](&this->m_arrays,(long)local_30);
    pvVar1->pointer = (void *)0x0;
  }
  return;
}

Assistant:

VertexArray::VertexArray (deUint32 name, int maxVertexAttribs)
	: NamedObject					(name)
	, m_elementArrayBufferBinding	(DE_NULL)
	, m_arrays						(maxVertexAttribs)
{
	for (int i = 0; i < maxVertexAttribs; ++i)
	{
		m_arrays[i].enabled			= false;
		m_arrays[i].size			= 4;
		m_arrays[i].stride			= 0;
		m_arrays[i].type			= GL_FLOAT;
		m_arrays[i].normalized		= false;
		m_arrays[i].integer			= false;
		m_arrays[i].divisor			= 0;
		m_arrays[i].bufferDeleted	= false;
		m_arrays[i].bufferBinding	= DE_NULL;
		m_arrays[i].pointer			= DE_NULL;
	}
}